

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isUInt64(Value *this)

{
  ValueType VVar1;
  bool local_29;
  Value *this_local;
  
  VVar1 = type(this);
  if (VVar1 == intValue) {
    this_local._7_1_ = -1 < (this->value_).int_;
  }
  else if (VVar1 == uintValue) {
    this_local._7_1_ = true;
  }
  else if (VVar1 == realValue) {
    local_29 = false;
    if ((0.0 <= (this->value_).real_) &&
       (local_29 = false,
       (this->value_).real_ <= 1.8446744073709552e+19 &&
       (this->value_).real_ != 1.8446744073709552e+19)) {
      local_29 = IsIntegral((this->value_).real_);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::isUInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type()) {
  case intValue:
    return value_.int_ >= 0;
  case uintValue:
    return true;
  case realValue:
    // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
    // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= 0 && value_.real_ < maxUInt64AsDouble &&
           IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}